

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgpaintelement.cpp
# Opt level: O1

SVGRadialGradientAttributes * __thiscall
lunasvg::SVGRadialGradientElement::collectGradientAttributes
          (SVGRadialGradientAttributes *__return_storage_ptr__,SVGRadialGradientElement *this)

{
  _Rb_tree_header *p_Var1;
  ElementID EVar2;
  _Base_ptr p_Var3;
  bool bVar4;
  SVGRadialGradientElement *pSVar5;
  _Base_ptr p_Var6;
  _Rb_tree_header *p_Var7;
  SVGRadialGradientElement *element;
  SVGGradientElement *current;
  set<const_lunasvg::SVGGradientElement_*,_std::less<const_lunasvg::SVGGradientElement_*>,_std::allocator<const_lunasvg::SVGGradientElement_*>_>
  processedGradients;
  SVGRadialGradientElement *local_68;
  _Rb_tree<const_lunasvg::SVGGradientElement_*,_const_lunasvg::SVGGradientElement_*,_std::_Identity<const_lunasvg::SVGGradientElement_*>,_std::less<const_lunasvg::SVGGradientElement_*>,_std::allocator<const_lunasvg::SVGGradientElement_*>_>
  local_60;
  
  __return_storage_ptr__->m_fy = (SVGRadialGradientElement *)0x0;
  __return_storage_ptr__->m_r = (SVGRadialGradientElement *)0x0;
  __return_storage_ptr__->m_fx = (SVGRadialGradientElement *)0x0;
  __return_storage_ptr__->m_cx = (SVGRadialGradientElement *)0x0;
  __return_storage_ptr__->m_cy = (SVGRadialGradientElement *)0x0;
  (__return_storage_ptr__->super_SVGGradientAttributes).m_gradientUnits = (SVGGradientElement *)0x0;
  (__return_storage_ptr__->super_SVGGradientAttributes).m_gradientContentElement =
       (SVGGradientElement *)0x0;
  (__return_storage_ptr__->super_SVGGradientAttributes).m_gradientTransform =
       (SVGGradientElement *)0x0;
  (__return_storage_ptr__->super_SVGGradientAttributes).m_spreadMethod = (SVGGradientElement *)0x0;
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68 = this;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  do {
    SVGGradientElement::collectGradientAttributes
              (&local_68->super_SVGGradientElement,
               &__return_storage_ptr__->super_SVGGradientAttributes);
    pSVar5 = local_68;
    if ((local_68->super_SVGGradientElement).super_SVGPaintElement.super_SVGElement.m_id ==
        RadialGradient) {
      if ((__return_storage_ptr__->m_cx == (SVGRadialGradientElement *)0x0) &&
         (bVar4 = SVGElement::hasAttribute((SVGElement *)local_68,Cx), bVar4)) {
        __return_storage_ptr__->m_cx = pSVar5;
      }
      if ((__return_storage_ptr__->m_cy == (SVGRadialGradientElement *)0x0) &&
         (bVar4 = SVGElement::hasAttribute((SVGElement *)pSVar5,Cy), bVar4)) {
        __return_storage_ptr__->m_cy = pSVar5;
      }
      if ((__return_storage_ptr__->m_r == (SVGRadialGradientElement *)0x0) &&
         (bVar4 = SVGElement::hasAttribute((SVGElement *)pSVar5,R), bVar4)) {
        __return_storage_ptr__->m_r = pSVar5;
      }
      if ((__return_storage_ptr__->m_fx == (SVGRadialGradientElement *)0x0) &&
         (bVar4 = SVGElement::hasAttribute((SVGElement *)pSVar5,Fx), bVar4)) {
        __return_storage_ptr__->m_fx = pSVar5;
      }
      if ((__return_storage_ptr__->m_fy == (SVGRadialGradientElement *)0x0) &&
         (bVar4 = SVGElement::hasAttribute((SVGElement *)pSVar5,Fy), bVar4)) {
        __return_storage_ptr__->m_fy = pSVar5;
      }
    }
    pSVar5 = (SVGRadialGradientElement *)
             SVGURIReference::getTargetElement
                       (&(local_68->super_SVGGradientElement).super_SVGURIReference,
                        (this->super_SVGGradientElement).super_SVGPaintElement.super_SVGElement.
                        super_SVGNode.m_document);
    if ((pSVar5 == (SVGRadialGradientElement *)0x0) ||
       ((EVar2 = (pSVar5->super_SVGGradientElement).super_SVGPaintElement.super_SVGElement.m_id,
        EVar2 != LinearGradient && (EVar2 != RadialGradient)))) break;
    std::
    _Rb_tree<lunasvg::SVGGradientElement_const*,lunasvg::SVGGradientElement_const*,std::_Identity<lunasvg::SVGGradientElement_const*>,std::less<lunasvg::SVGGradientElement_const*>,std::allocator<lunasvg::SVGGradientElement_const*>>
    ::_M_insert_unique<lunasvg::SVGGradientElement_const*const&>
              ((_Rb_tree<lunasvg::SVGGradientElement_const*,lunasvg::SVGGradientElement_const*,std::_Identity<lunasvg::SVGGradientElement_const*>,std::less<lunasvg::SVGGradientElement_const*>,std::allocator<lunasvg::SVGGradientElement_const*>>
                *)&local_60,(SVGGradientElement **)&local_68);
    p_Var6 = &p_Var1->_M_header;
    for (p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
        (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
        p_Var3 = (&p_Var3->_M_left)[*(SVGRadialGradientElement **)(p_Var3 + 1) < pSVar5]) {
      if (*(SVGRadialGradientElement **)(p_Var3 + 1) >= pSVar5) {
        p_Var6 = p_Var3;
      }
    }
    p_Var7 = p_Var1;
    if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
       (p_Var7 = (_Rb_tree_header *)p_Var6,
       pSVar5 < (SVGRadialGradientElement *)((_Rb_tree_header *)p_Var6)->_M_node_count)) {
      p_Var7 = p_Var1;
    }
    local_68 = pSVar5;
  } while (p_Var7 == p_Var1);
  SVGRadialGradientAttributes::setDefaultValues(__return_storage_ptr__,this);
  std::
  _Rb_tree<const_lunasvg::SVGGradientElement_*,_const_lunasvg::SVGGradientElement_*,_std::_Identity<const_lunasvg::SVGGradientElement_*>,_std::less<const_lunasvg::SVGGradientElement_*>,_std::allocator<const_lunasvg::SVGGradientElement_*>_>
  ::~_Rb_tree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

SVGRadialGradientAttributes SVGRadialGradientElement::collectGradientAttributes() const
{
    SVGRadialGradientAttributes attributes;
    std::set<const SVGGradientElement*> processedGradients;
    const SVGGradientElement* current = this;
    while(true) {
        current->collectGradientAttributes(attributes);
        if(current->id() == ElementID::RadialGradient) {
            auto element = static_cast<const SVGRadialGradientElement*>(current);
            if(!attributes.hasCx() && element->hasAttribute(PropertyID::Cx))
                attributes.setCx(element);
            if(!attributes.hasCy() && element->hasAttribute(PropertyID::Cy))
                attributes.setCy(element);
            if(!attributes.hasR() && element->hasAttribute(PropertyID::R))
                attributes.setR(element);
            if(!attributes.hasFx() && element->hasAttribute(PropertyID::Fx))
                attributes.setFx(element);
            if(!attributes.hasFy() && element->hasAttribute(PropertyID::Fy)) {
                attributes.setFy(element);
            }
        }

        auto targetElement = current->getTargetElement(document());
        if(!targetElement || !(targetElement->id() == ElementID::LinearGradient || targetElement->id() == ElementID::RadialGradient))
            break;
        processedGradients.insert(current);
        current = static_cast<const SVGGradientElement*>(targetElement);
        if(processedGradients.count(current) > 0) {
            break;
        }
    }

    attributes.setDefaultValues(this);
    return attributes;
}